

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_then_execute.cpp
# Opt level: O0

void test_then_execute<has_then_execute_member>(has_then_execute_member *exec)

{
  int iVar1;
  undefined1 *puVar2;
  undefined1 local_e0 [8];
  undefined1 local_d8 [8];
  executor_future_t<has_then_execute_member,_typename_std::result_of<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_jaredhoberock[P]future_test_then_execute_cpp:136:75)_()>::type>
  result_future_3;
  int expect_thirteen;
  future<void> predecessor_future_3;
  undefined1 local_a8 [8];
  executor_future_t<has_then_execute_member,_typename_std::result_of<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_jaredhoberock[P]future_test_then_execute_cpp:118:75)_(future_result_t<future<int>_>_&)>::type>
  result_future_2;
  int result;
  future<int> predecessor_future_2;
  undefined1 local_78 [8];
  executor_future_t<has_then_execute_member,_typename_std::result_of<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_jaredhoberock[P]future_test_then_execute_cpp:102:75)_()>::type>
  result_future_1;
  undefined1 local_60 [8];
  future<void> predecessor_future_1;
  undefined1 local_39;
  undefined1 local_38 [8];
  executor_future_t<has_then_execute_member,_typename_std::result_of<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_jaredhoberock[P]future_test_then_execute_cpp:88:75)_(future_result_t<future<int>_>_&)>::type>
  result_future;
  undefined1 local_20 [8];
  future<int> predecessor_future;
  has_then_execute_member *exec_local;
  
  predecessor_future.super___basic_future<int>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)exec;
  std::
  async<test_then_execute<has_then_execute_member>(has_then_execute_member_const&)::_lambda()_1_>
            ((type *)local_20);
  std::experimental::execution::v1::detail::then_execute_customization_point::
  operator()<has_then_execute_member,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_jaredhoberock[P]future_test_then_execute_cpp:88:75),_std::future<int>,_nullptr,_nullptr>
            ((then_execute_customization_point *)local_38,
             (has_then_execute_member *)
             &std::experimental::execution::v1::(anonymous_namespace)::then_execute,
             (anon_class_1_0_00000001_for_func *)
             predecessor_future.super___basic_future<int>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi,(future<int> *)&local_39);
  iVar1 = std::future<int>::get((future<int> *)local_38);
  if (iVar1 != 2) {
    __assert_fail("2 == result_future.get()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_then_execute.cpp"
                  ,0x5f,
                  "void test_then_execute(const Executor &) [Executor = has_then_execute_member]");
  }
  std::future<int>::~future((future<int> *)local_38);
  std::future<int>::~future((future<int> *)local_20);
  std::
  async<test_then_execute<has_then_execute_member>(has_then_execute_member_const&)::_lambda()_2_>
            ((type *)local_60);
  std::experimental::execution::v1::detail::then_execute_customization_point::
  operator()<has_then_execute_member,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_jaredhoberock[P]future_test_then_execute_cpp:102:75),_std::future<void>,_nullptr,_nullptr>
            ((then_execute_customization_point *)local_78,
             (has_then_execute_member *)
             &std::experimental::execution::v1::(anonymous_namespace)::then_execute,
             (anon_class_1_0_00000001_for_func *)
             predecessor_future.super___basic_future<int>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi,
             (future<void> *)
             ((long)&predecessor_future_2.super___basic_future<int>._M_state.
                     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  iVar1 = std::future<int>::get((future<int> *)local_78);
  if (iVar1 != 1) {
    __assert_fail("1 == result_future.get()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_then_execute.cpp"
                  ,0x6d,
                  "void test_then_execute(const Executor &) [Executor = has_then_execute_member]");
  }
  std::future<int>::~future((future<int> *)local_78);
  std::future<void>::~future((future<void> *)local_60);
  std::
  async<test_then_execute<has_then_execute_member>(has_then_execute_member_const&)::_lambda()_4_>
            ((type *)&result);
  result_future_2.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._0_4_ = 0;
  predecessor_future_3.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          &result_future_2.super___basic_future<void>._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount;
  puVar2 = &std::experimental::execution::v1::(anonymous_namespace)::then_execute;
  std::experimental::execution::v1::detail::then_execute_customization_point::
  operator()<has_then_execute_member,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_jaredhoberock[P]future_test_then_execute_cpp:118:75),_std::future<int>,_nullptr,_nullptr>
            ((then_execute_customization_point *)local_a8,
             (has_then_execute_member *)
             &std::experimental::execution::v1::(anonymous_namespace)::then_execute,
             (anon_class_8_1_6971b95b_for_func *)
             predecessor_future.super___basic_future<int>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi,
             (future<int> *)
             &predecessor_future_3.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__basic_future<void>::wait((__basic_future<void> *)local_a8,puVar2);
  if ((int)result_future_2.super___basic_future<void>._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi != 1) {
    __assert_fail("1 == result",
                  "/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_then_execute.cpp"
                  ,0x7f,
                  "void test_then_execute(const Executor &) [Executor = has_then_execute_member]");
  }
  std::future<void>::~future((future<void> *)local_a8);
  std::future<int>::~future((future<int> *)&result);
  std::
  async<test_then_execute<has_then_execute_member>(has_then_execute_member_const&)::_lambda()_5_>
            ((type *)&expect_thirteen);
  result_future_3.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._0_4_ = 0;
  local_e0 = (undefined1  [8])
             &result_future_3.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
  puVar2 = &std::experimental::execution::v1::(anonymous_namespace)::then_execute;
  std::experimental::execution::v1::detail::then_execute_customization_point::
  operator()<has_then_execute_member,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_jaredhoberock[P]future_test_then_execute_cpp:136:75),_std::future<void>,_nullptr,_nullptr>
            ((then_execute_customization_point *)local_d8,
             (has_then_execute_member *)
             &std::experimental::execution::v1::(anonymous_namespace)::then_execute,
             (anon_class_8_1_f8e7f5fd_for_func *)
             predecessor_future.super___basic_future<int>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi,(future<void> *)local_e0);
  std::__basic_future<void>::wait((__basic_future<void> *)local_d8,puVar2);
  if ((int)result_future_3.super___basic_future<void>._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi == 0xd) {
    std::future<void>::~future((future<void> *)local_d8);
    std::future<void>::~future((future<void> *)&expect_thirteen);
    return;
  }
  __assert_fail("13 == expect_thirteen",
                "/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_then_execute.cpp"
                ,0x91,
                "void test_then_execute(const Executor &) [Executor = has_then_execute_member]");
}

Assistant:

void test_then_execute(const Executor& exec)
{
  {
    // non-void predecessor to non-void result

    std::future<int> predecessor_future = std::async([] { return 1; });

    auto result_future = std::experimental::execution::then_execute(exec, [](int& predecessor)
    {
      return 1 + predecessor;
    },
    predecessor_future
    );

    assert(2 == result_future.get());
  }

  {
    // void predecessor to non-void result
    std::future<void> predecessor_future = std::async([]{});

    auto result_future = std::experimental::execution::then_execute(exec, []
    {
      return 1;
    },
    predecessor_future
    );

    assert(1 == result_future.get());
  }

  {
    // non-void predecessor_future to void result

    std::future<int> predecessor_future = std::async([] { return 1; });

    int result = 0;
    auto result_future = std::experimental::execution::then_execute(exec, [&](int& predecessor)
    {
      result = predecessor;
    },
    predecessor_future
    );

    result_future.wait();

    assert(1 == result);
  }

  {
    // void predecessor_future to void result

    std::future<void> predecessor_future = std::async([]{});

    int expect_thirteen = 0;
    auto result_future = std::experimental::execution::then_execute(exec, [&]
    {
      expect_thirteen = 13;
    },
    predecessor_future
    );

    result_future.wait();

    assert(13 == expect_thirteen);
  }
}